

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O0

float __thiscall
o3dgc::BinaryStream::ReadFloat32
          (BinaryStream *this,unsigned_long *position,O3DGCStreamType streamType)

{
  undefined4 local_20;
  float value;
  O3DGCStreamType streamType_local;
  unsigned_long *position_local;
  BinaryStream *this_local;
  
  if (streamType == O3DGC_STREAM_TYPE_ASCII) {
    local_20 = ReadFloat32ASCII(this,position);
  }
  else {
    local_20 = ReadFloat32Bin(this,position);
  }
  return local_20;
}

Assistant:

float                   ReadFloat32(unsigned long & position, O3DGCStreamType streamType) const
                                {
                                    float value;
                                    if (streamType == O3DGC_STREAM_TYPE_ASCII)
                                    {
                                        value = ReadFloat32ASCII(position);
                                    }
                                    else
                                    {
                                        value = ReadFloat32Bin(position);
                                    }
                                    return value;
                                }